

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_graph_demo.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  iterator iVar1;
  ostream *poVar2;
  _List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge> *e;
  pointer p_Var3;
  SimpleState **ppSVar4;
  vector<SimpleState_*,_std::allocator<SimpleState_*>_> *__range1;
  int i;
  int iVar5;
  code **ppcVar6;
  CalcHeuristicFunc_t<SimpleState_*,_double> *in_R9;
  SimpleState **e_1;
  pointer ppSVar7;
  int j;
  int iVar8;
  vector<SimpleState_*,_std::allocator<SimpleState_*>_> nodes;
  Graph<SimpleState_*,_double,_SimpleStateIndexer> graph;
  Path<SimpleState_*> path_d;
  Path<SimpleState_*> path_a;
  vector<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_>_>
  all_edges;
  SimpleState **local_f8;
  iterator iStack_f0;
  SimpleState **local_e8;
  Graph<SimpleState_*,_double,_SimpleStateIndexer> local_d8;
  Path<SimpleState_*> local_98;
  Path<SimpleState_*> local_80;
  vector<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_>_>
  local_68;
  code *local_50;
  undefined8 local_48;
  code *local_40;
  code *local_38;
  
  local_f8 = (SimpleState **)0x0;
  iStack_f0._M_current = (SimpleState **)0x0;
  local_e8 = (SimpleState **)0x0;
  iVar5 = 0;
  do {
    iVar8 = 0;
    do {
      local_d8._0_8_ = operator_new(8);
      ((SimpleState *)local_d8._0_8_)->row = iVar5;
      ((SimpleState *)local_d8._0_8_)->col = iVar8;
      if (iStack_f0._M_current == local_e8) {
        std::vector<SimpleState*,std::allocator<SimpleState*>>::_M_realloc_insert<SimpleState*>
                  ((vector<SimpleState*,std::allocator<SimpleState*>> *)&local_f8,iStack_f0,
                   (SimpleState **)&local_d8);
      }
      else {
        *iStack_f0._M_current = (SimpleState *)local_d8._0_8_;
        iStack_f0._M_current = iStack_f0._M_current + 1;
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 != 4);
    iVar5 = iVar5 + 1;
  } while (iVar5 != 4);
  local_d8.vertex_map_._M_h._M_buckets = &local_d8.vertex_map_._M_h._M_single_bucket;
  local_d8.vertex_map_._M_h._M_bucket_count = 1;
  local_d8.vertex_map_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_d8.vertex_map_._M_h._M_element_count = 0;
  local_d8.vertex_map_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_d8.vertex_map_._M_h._M_rehash_policy._M_next_resize = 0;
  local_d8.vertex_map_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (&local_d8,*local_f8,local_f8[1],1.0);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (&local_d8,local_f8[1],*local_f8,1.0);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (&local_d8,local_f8[1],local_f8[2],1.0);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (&local_d8,local_f8[1],local_f8[6],1.414);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (&local_d8,local_f8[2],local_f8[1],1.0);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (&local_d8,local_f8[2],local_f8[3],1.0);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (&local_d8,local_f8[2],local_f8[6],1.0);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (&local_d8,local_f8[3],local_f8[2],1.0);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (&local_d8,local_f8[3],local_f8[6],1.414);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (&local_d8,local_f8[6],local_f8[1],1.414);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (&local_d8,local_f8[6],local_f8[2],1.0);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (&local_d8,local_f8[6],local_f8[3],1.414);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (&local_d8,local_f8[6],local_f8[9],1.414);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (&local_d8,local_f8[6],local_f8[10],1.0);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (&local_d8,local_f8[9],local_f8[6],1.414);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (&local_d8,local_f8[9],local_f8[10],1.0);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (&local_d8,local_f8[9],local_f8[0xd],1.0);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (&local_d8,local_f8[10],local_f8[6],1.0);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (&local_d8,local_f8[10],local_f8[9],1.0);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (&local_d8,local_f8[10],local_f8[0xd],1.414);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (&local_d8,local_f8[0xd],local_f8[9],1.0);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::AddEdge
            (&local_d8,local_f8[0xd],local_f8[10],1.414);
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::GetAllEdges(&local_68,&local_d8);
  for (p_Var3 = local_68.
                super__Vector_base<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      p_Var3 != local_68.
                super__Vector_base<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; p_Var3 = p_Var3 + 1) {
    xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge::PrintEdge
              ((Edge *)(p_Var3->_M_node + 1));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nA* search: ",0xc);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  ppcVar6 = &local_50;
  local_48 = 0;
  local_50 = CalcHeuristic;
  local_38 = std::
             _Function_handler<double_(SimpleState_*,_SimpleState_*),_double_(*)(SimpleState_*,_SimpleState_*)>
             ::_M_invoke;
  local_40 = std::
             _Function_handler<double_(SimpleState_*,_SimpleState_*),_double_(*)(SimpleState_*,_SimpleState_*)>
             ::_M_manager;
  xmotion::AStar::Search<SimpleState*,double,SimpleStateIndexer,int>
            (&local_80,(AStar *)&local_d8,(Graph<SimpleState_*,_double,_SimpleStateIndexer> *)0x0,
             0xd,(int)ppcVar6,in_R9);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,3);
  }
  iVar5 = (int)ppcVar6;
  for (ppSVar7 = local_80.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppSVar7 !=
      local_80.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppSVar7 = ppSVar7 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"id: ",4);
    poVar2 = std::ostream::_M_insert<long>((long)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    iVar5 = (int)ppcVar6;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nDijkstra search: ",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  xmotion::Dijkstra::Search<SimpleState*,double,SimpleStateIndexer,int>
            (&local_98,(Dijkstra *)&local_d8,(Graph<SimpleState_*,_double,_SimpleStateIndexer> *)0x0
             ,0xd,iVar5);
  ppSVar4 = local_f8;
  iVar1._M_current = iStack_f0._M_current;
  for (ppSVar7 = local_98.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
                 super__Vector_impl_data._M_start; local_f8 = ppSVar4,
      iStack_f0._M_current = iVar1._M_current,
      ppSVar7 !=
      local_98.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppSVar7 = ppSVar7 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"id: ",4);
    poVar2 = std::ostream::_M_insert<long>((long)&std::cout);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    ppSVar4 = local_f8;
    iVar1._M_current = iStack_f0._M_current;
  }
  for (; ppSVar4 != iVar1._M_current; ppSVar4 = ppSVar4 + 1) {
    operator_delete(*ppSVar4);
  }
  if (local_98.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_80.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<SimpleState_*,_std::allocator<SimpleState_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.
      super__Vector_base<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>,_std::allocator<std::_List_iterator<xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::Edge>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  xmotion::Graph<SimpleState_*,_double,_SimpleStateIndexer>::~Graph(&local_d8);
  if (local_f8 != (SimpleState **)0x0) {
    operator_delete(local_f8);
  }
  return 0;
}

Assistant:

int main(int argc, char **argv) {
  SimpleStateIndexer indexer;

  std::vector<SimpleState *> nodes;

  // create nodes
  for (int i = 0; i < ROW_SIZE; i++)
    for (int j = 0; j < COL_SIZE; j++) nodes.push_back(new SimpleState(i, j));

  // create a graph
  Graph<SimpleState *, double, SimpleStateIndexer> graph;

  graph.AddEdge(nodes[0], nodes[1], 1.0);
  graph.AddEdge(nodes[1], nodes[0], 1.0);
  graph.AddEdge(nodes[1], nodes[2], 1.0);
  graph.AddEdge(nodes[1], nodes[6], 1.414);
  graph.AddEdge(nodes[2], nodes[1], 1.0);
  graph.AddEdge(nodes[2], nodes[3], 1.0);
  graph.AddEdge(nodes[2], nodes[6], 1.0);
  graph.AddEdge(nodes[3], nodes[2], 1.0);
  graph.AddEdge(nodes[3], nodes[6], 1.414);
  graph.AddEdge(nodes[6], nodes[1], 1.414);
  graph.AddEdge(nodes[6], nodes[2], 1.0);
  graph.AddEdge(nodes[6], nodes[3], 1.414);
  graph.AddEdge(nodes[6], nodes[9], 1.414);
  graph.AddEdge(nodes[6], nodes[10], 1.0);
  graph.AddEdge(nodes[9], nodes[6], 1.414);
  graph.AddEdge(nodes[9], nodes[10], 1.0);
  graph.AddEdge(nodes[9], nodes[13], 1.0);
  graph.AddEdge(nodes[10], nodes[6], 1.0);
  graph.AddEdge(nodes[10], nodes[9], 1.0);
  graph.AddEdge(nodes[10], nodes[13], 1.414);
  graph.AddEdge(nodes[13], nodes[9], 1.0);
  graph.AddEdge(nodes[13], nodes[10], 1.414);

  auto all_edges = graph.GetAllEdges();

  for (auto &e : all_edges) e->PrintEdge();

  // In order to use A* search, you need to specify how to calculate heuristic
  std::cout << "\nA* search: " << std::endl;
  auto path_a = AStar::Search(
      &graph, 0, 13, CalcHeuristicFunc_t<SimpleState *>(CalcHeuristic));
  for (auto &e : path_a) std::cout << "id: " << indexer(e) << std::endl;

  // Dijkstra search
  std::cout << "\nDijkstra search: " << std::endl;
  auto path_d = Dijkstra::Search(&graph, 0, 13);
  for (auto &e : path_d) std::cout << "id: " << indexer(e) << std::endl;

  // need to delete all nodes, the graph only maintains pointers to these nodes
  for (auto &e : nodes) delete e;

  return 0;
}